

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O1

int GetLatestMTMessageMT(MT *pMT,int addr,int mid,uchar *databuf,int databuflen,int *pNbdatabytes)

{
  byte *pbVar1;
  int iVar2;
  uchar *__dest;
  int iVar3;
  ulong uVar4;
  __time_t _Var5;
  long *plVar6;
  char cVar7;
  uint uVar8;
  size_t __n;
  ulong uVar9;
  char *__s;
  int len;
  uchar *ptr;
  CHRONO chrono;
  uchar recvbuf [4096];
  uchar savebuf [2048];
  timespec local_18b8;
  int local_18a8;
  int local_18a4;
  uchar *local_18a0;
  int local_1894;
  uint *local_1890;
  timespec local_1888;
  undefined8 local_1878;
  undefined8 uStack_1870;
  long local_1868;
  long lStack_1860;
  timespec local_1858;
  int local_1848;
  uchar *local_1840;
  uchar local_1838 [2047];
  undefined1 auStack_1039 [2049];
  undefined1 local_838 [2056];
  
  local_18a0 = (uchar *)0x0;
  local_18a4 = 0;
  local_18a8 = mid;
  local_1894 = databuflen;
  local_1890 = (uint *)pNbdatabytes;
  iVar3 = clock_getres(4,&local_1858);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_1888), iVar3 == 0)) {
    local_1848 = 0;
    local_1878 = 0;
    uStack_1870 = 0;
    local_1868 = 0;
    lStack_1860 = 0;
  }
  uVar4 = 0;
  memset(local_1838,0,0x1000);
  memset(local_838,0,0x800);
  iVar3 = (pMT->RS232Port).DevType;
  cVar7 = '\x01';
  if (iVar3 - 1U < 4) {
    uVar4 = recv((pMT->RS232Port).s,local_1838,0x7ff,0);
    if (-1 < (int)uVar4) {
      cVar7 = ((int)uVar4 == 0) * '\x02';
    }
  }
  else if (iVar3 == 0) {
    uVar4 = read(*(int *)&(pMT->RS232Port).hDev,local_1838,0x7ff);
    cVar7 = '\x01';
    if (-1 < (int)uVar4) {
      cVar7 = ((int)uVar4 == 0) * '\x02';
    }
  }
  if (cVar7 == '\0') {
    local_1840 = databuf;
    if ((int)uVar4 < 0x7ff) {
      uVar9 = uVar4 & 0xffffffff;
LAB_001b9696:
      iVar3 = FindLatestMTMessage(local_1838,(int)uVar9,addr,local_18a8,&local_18a0,&local_18a4);
      if (iVar3 != 0) {
        do {
          if (local_1848 == 0) {
            clock_gettime(4,&local_18b8);
            local_18b8.tv_sec =
                 (local_18b8.tv_sec + local_1868 + (local_18b8.tv_nsec + lStack_1860) / 1000000000)
                 - local_1888.tv_sec;
            local_18b8.tv_nsec =
                 (local_18b8.tv_nsec + lStack_1860) % 1000000000 - local_1888.tv_nsec;
            if (local_18b8.tv_nsec < 0) {
              local_18b8.tv_sec = local_18b8.tv_sec + local_18b8.tv_nsec / 1000000000 + -1;
              local_18b8.tv_nsec = local_18b8.tv_nsec % 1000000000 + 1000000000;
            }
            plVar6 = &local_18b8.tv_nsec;
            _Var5 = local_18b8.tv_sec;
          }
          else {
            plVar6 = &lStack_1860;
            _Var5 = local_1868;
          }
          if (4.0 < (double)*plVar6 / 1000000000.0 + (double)_Var5) {
LAB_001b9890:
            puts("Error reading data from a MT : Message timeout. ");
            return 2;
          }
          iVar3 = (int)uVar9;
          if (0xffe < iVar3) {
            puts("Error reading data from a MT : Invalid data. ");
            return 4;
          }
          iVar2 = (pMT->RS232Port).DevType;
          cVar7 = '\x01';
          if (iVar2 - 1U < 4) {
            uVar4 = recv((pMT->RS232Port).s,local_1838 + iVar3,(long)(int)(0xfffU - iVar3),0);
            if (-1 < (int)uVar4) {
              cVar7 = ((int)uVar4 == 0) * '\x02';
            }
          }
          else if (iVar2 == 0) {
            uVar4 = read(*(int *)&(pMT->RS232Port).hDev,local_1838 + iVar3,(ulong)(0xfffU - iVar3));
            cVar7 = ((int)uVar4 == 0) * '\x02';
            if ((int)uVar4 < 0) {
              cVar7 = '\x01';
            }
          }
          if (cVar7 != '\0') goto LAB_001b9495;
          uVar8 = iVar3 + (int)uVar4;
          uVar9 = (ulong)uVar8;
          iVar3 = FindLatestMTMessage(local_1838,uVar8,addr,local_18a8,&local_18a0,&local_18a4);
        } while (iVar3 != 0);
      }
      __dest = local_1840;
      iVar3 = local_1894;
      memset(local_1840,0,(long)local_1894);
      pbVar1 = local_18a0 + 3;
      if (*pbVar1 == 0xff) {
        *local_1890 = (uint)(ushort)(*(ushort *)(local_18a0 + 4) << 8 |
                                    *(ushort *)(local_18a0 + 4) >> 8);
        local_18a0 = local_18a0 + 6;
      }
      else {
        local_18a0 = local_18a0 + 4;
        *local_1890 = (uint)*pbVar1;
      }
      uVar8 = *local_1890;
      if ((int)uVar8 <= iVar3) {
        if ((int)uVar8 < 1) {
          return 0;
        }
        memcpy(__dest,local_18a0,(ulong)uVar8);
        return 0;
      }
      __s = "Too small data buffer.";
      goto LAB_001b949c;
    }
    do {
      iVar3 = (int)uVar4;
      if (iVar3 != 0x7ff) {
        __n = (size_t)iVar3;
        memmove(auStack_1039 + -__n,local_1838,__n);
        uVar9 = 0x7ff;
        memcpy(local_1838,local_838 + __n,(long)(0x7ff - iVar3));
        goto LAB_001b9696;
      }
      if (local_1848 == 0) {
        clock_gettime(4,&local_18b8);
        local_18b8.tv_sec =
             (local_18b8.tv_sec + local_1868 + (local_18b8.tv_nsec + lStack_1860) / 1000000000) -
             local_1888.tv_sec;
        local_18b8.tv_nsec = (local_18b8.tv_nsec + lStack_1860) % 1000000000 - local_1888.tv_nsec;
        if (local_18b8.tv_nsec < 0) {
          local_18b8.tv_sec = local_18b8.tv_sec + local_18b8.tv_nsec / 1000000000 + -1;
          local_18b8.tv_nsec = local_18b8.tv_nsec % 1000000000 + 1000000000;
        }
        plVar6 = &local_18b8.tv_nsec;
        _Var5 = local_18b8.tv_sec;
      }
      else {
        plVar6 = &lStack_1860;
        _Var5 = local_1868;
      }
      if (4.0 < (double)*plVar6 / 1000000000.0 + (double)_Var5) goto LAB_001b9890;
      memcpy(local_838,local_1838,uVar4 & 0xffffffff);
      iVar3 = (pMT->RS232Port).DevType;
      cVar7 = '\x01';
      if (iVar3 - 1U < 4) {
        uVar4 = recv((pMT->RS232Port).s,local_1838,0x7ff,0);
        if (-1 < (int)uVar4) {
          cVar7 = ((int)uVar4 == 0) * '\x02';
        }
      }
      else if (iVar3 == 0) {
        uVar4 = read(*(int *)&(pMT->RS232Port).hDev,local_1838,0x7ff);
        cVar7 = ((int)uVar4 == 0) * '\x02';
        if ((int)uVar4 < 0) {
          cVar7 = '\x01';
        }
      }
    } while (cVar7 == '\0');
  }
LAB_001b9495:
  __s = "Error reading data from a MT. ";
LAB_001b949c:
  puts(__s);
  return 1;
}

Assistant:

inline int GetLatestMTMessageMT(MT* pMT, int addr, int mid, unsigned char* databuf, int databuflen, int* pNbdatabytes)
{
	unsigned char recvbuf[2*MAX_NB_BYTES_MT];
	unsigned char savebuf[MAX_NB_BYTES_MT];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	unsigned char* ptr = NULL;
	int len = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_MT-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pMT->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a MT. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_MT)
			{
				printf("Error reading data from a MT : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pMT->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a MT. \n");
				return EXIT_FAILURE;
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	while (FindLatestMTMessage(recvbuf, BytesReceived, addr, mid, &ptr, &len) != EXIT_SUCCESS)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_MT)
		{
			printf("Error reading data from a MT : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_MT-1)
		{
			printf("Error reading data from a MT : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pMT->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_MT-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a MT. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += Bytes;
	}

	// Get data bytes.

	memset(databuf, 0, databuflen);
	ptr = GetDataBytesMTMessage(ptr, pNbdatabytes);
	// Check the number of data bytes before copy.
	if (databuflen < *pNbdatabytes)
	{
		printf("Too small data buffer.\n");
		return EXIT_FAILURE;
	}
	// Copy the data bytes of the message.
	if (*pNbdatabytes > 0)
	{
		memcpy(databuf, ptr, *pNbdatabytes);
	}

	return EXIT_SUCCESS;
}